

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O3

void __thiscall ipx::Basis::FreeBasicVariable(Basis *this,Int j)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  
  piVar3 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = this->model_->num_rows_;
  iVar2 = piVar3[j];
  if (iVar2 < 0 || iVar2 < iVar1) {
    piVar3[j] = iVar2 + iVar1;
  }
  return;
}

Assistant:

void Basis::FreeBasicVariable(Int j) {
    const Int m = model_.rows();
    if (StatusOf(j) == BASIC_FREE)
        return;
    assert(StatusOf(j) == BASIC);
    assert(map2basis_[j] >= 0 && map2basis_[j] < m);
    map2basis_[j] += m;
}